

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
image_match::get_image_paths
          (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           *__return_storage_ptr__,path *root)

{
  source_loc loc;
  source_loc loc_00;
  bool bVar1;
  path *this;
  logger *plVar2;
  basic_string_view<char> local_118;
  undefined1 local_108 [40];
  path local_e0;
  recursive_directory_iterator __end1;
  recursive_directory_iterator local_a8;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_90;
  path normalized;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_58;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  std::filesystem::absolute(&local_e0);
  std::filesystem::__cxx11::path::lexically_normal();
  CLI::std::filesystem::__cxx11::path::~path((path *)&local_e0);
  CLI::std::filesystem::__cxx11::path::string((string *)&local_e0,(path *)&normalized);
  spdlog::info<char[27],std::__cxx11::string>
            ((char (*) [27])"Searching for images in {}",&local_e0._M_pathname);
  std::__cxx11::string::~string((string *)&local_e0);
  (__return_storage_ptr__->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_90,&normalized);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_58,&local_90);
  local_a8._M_dirs._M_ptr = local_58._M_ptr;
  local_a8._M_dirs._M_refcount._M_pi = local_58._M_refcount._M_pi;
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_58);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,&local_90);
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_40);
  while (local_a8._M_dirs._M_refcount._M_pi != __end1._M_dirs._M_refcount._M_pi) {
    this = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&local_a8);
    plVar2 = spdlog::default_logger_raw();
    CLI::std::filesystem::__cxx11::path::string((string *)&local_e0,this);
    local_108._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
    ;
    local_108._8_4_ = 0xad;
    local_108._16_8_ = "get_image_paths";
    local_118.data_ = "Found file {}";
    local_118.size_ = 0xd;
    loc._12_4_ = local_108._12_4_;
    loc.line = 0xad;
    loc.filename = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
    ;
    loc.funcname = "get_image_paths";
    spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
              (plVar2,loc,debug,&local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar1 = is_valid_file((path *)this);
    if (bVar1) {
      plVar2 = spdlog::default_logger_raw();
      CLI::std::filesystem::__cxx11::path::string((string *)&local_e0,this);
      local_108._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      local_108._8_4_ = 0xb0;
      local_108._16_8_ = "get_image_paths";
      local_118.data_ = "Adding file {}";
      local_118.size_ = 0xe;
      loc_00._12_4_ = local_108._12_4_;
      loc_00.line = 0xb0;
      loc_00.filename =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      loc_00.funcname = "get_image_paths";
      spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
                (plVar2,loc_00,debug,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::filesystem::absolute((path *)local_108);
      std::filesystem::__cxx11::path::lexically_normal();
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      emplace_back<std::filesystem::__cxx11::path>(__return_storage_ptr__,&local_e0);
      CLI::std::filesystem::__cxx11::path::~path((path *)&local_e0);
      CLI::std::filesystem::__cxx11::path::~path((path *)local_108);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_a8);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&__end1);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_a8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_90);
  CLI::std::filesystem::__cxx11::path::~path((path *)&normalized);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::filesystem::path>
get_image_paths(const std::filesystem::path& root)
{
    auto normalized = fs::absolute(root).lexically_normal();
    spdlog::info("Searching for images in {}", normalized.string());

    std::vector<fs::path> image_paths;
    for (auto&& dir_entry : fs::recursive_directory_iterator(normalized)) {
        SPDLOG_DEBUG("Found file {}", dir_entry.path().string());

        if (is_valid_file(dir_entry.path())) {
            SPDLOG_DEBUG("Adding file {}", dir_entry.path().string());

            image_paths.push_back(
              fs::absolute(dir_entry.path()).lexically_normal());
        }
    }

    return image_paths;
}